

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::GetDescriptor
          (SimpleTypeHandler<1UL> *this,PropertyId propertyId,PropertyIndex *index)

{
  ushort uVar1;
  
  if (this->propertyCount < 1) {
    return 0;
  }
  uVar1 = 0;
  do {
    if ((this->descriptors[uVar1].Id.ptr)->pid == propertyId) {
      *index = uVar1;
      return 1;
    }
    uVar1 = uVar1 + 1;
  } while ((uint)uVar1 < (uint)this->propertyCount);
  return 0;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetDescriptor(PropertyId propertyId, PropertyIndex * index)
    {
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                *index = i;
                return true;
            }
        }
        return false;
    }